

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O1

void * QRunnable::QGenericRunnable::
       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4952:5)>
       ::impl(Op op,HelperBase *that,void *arg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  OpFn p_Var6;
  long lVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  if (op == Destroy) {
    if (that != (HelperBase *)0x0) {
      operator_delete(that,0x20);
    }
  }
  else if (op == Run) {
    iVar2 = *(int *)((long)&that[1].fn + 4);
    if (0 < iVar2) {
      p_Var6 = that[2].fn;
      iVar3 = *(int *)&that[1].fn;
      lVar9 = (long)iVar3;
      do {
        lVar7 = *(long *)p_Var6;
        lVar10 = lVar9 * 0x10;
        iVar15 = *(int *)(lVar7 + 4 + lVar10);
        if (iVar15 != 0) {
          bVar1 = *(byte *)(lVar7 + 0xc + lVar10);
          iVar4 = *(int *)(p_Var6 + 0x18);
          iVar13 = *(int *)(lVar7 + lVar10);
          uVar5 = *(uint *)(p_Var6 + 0x14);
          iVar11 = (*(int *)(lVar7 + 8 + lVar10) + *(int *)(p_Var6 + 0x10)) % (int)uVar5;
          iVar12 = (*(int *)(p_Var6 + 8) + iVar13) % (int)*(uint *)(p_Var6 + 0xc);
          iVar12 = (iVar12 >> 0x1f & *(uint *)(p_Var6 + 0xc)) + iVar12;
          do {
            iVar14 = *(int *)(p_Var6 + 0xc) - iVar12;
            if (iVar15 <= *(int *)(p_Var6 + 0xc) - iVar12) {
              iVar14 = iVar15;
            }
            if (0x7ff < iVar14) {
              iVar14 = 0x800;
            }
            plVar8 = *(long **)(p_Var6 + 0x20);
            (**(code **)(p_Var6 + 0x28))
                      ((long)*(int *)(*(long *)p_Var6 + 8 + lVar10) * *(long *)(*plVar8 + 0x28) +
                       *(long *)(*plVar8 + 0x38) + (long)iVar13 * 4,
                       plVar8[0x19] * (long)(int)((iVar11 >> 0x1f & uVar5) + iVar11) + plVar8[0x15]
                       + (long)iVar12 * 4,iVar14,(int)((uint)bVar1 * iVar4) >> 8);
            iVar13 = iVar13 + iVar14;
            iVar12 = iVar12 + iVar14;
            if (*(int *)(p_Var6 + 0xc) <= iVar12) {
              iVar12 = 0;
            }
            iVar15 = iVar15 - iVar14;
          } while (iVar15 != 0);
        }
        lVar9 = lVar9 + 1;
      } while (iVar2 + iVar3 != (int)lVar9);
    }
    QSemaphore::release((int)that[3].fn);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }